

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

effect * object_effect(object *obj)

{
  object *obj_local;
  
  if (obj->activation == (activation *)0x0) {
    if (obj->effect == (effect *)0x0) {
      obj_local = (object *)0x0;
    }
    else {
      obj_local = (object *)obj->effect;
    }
  }
  else {
    obj_local = (object *)obj->activation->effect;
  }
  return (effect *)obj_local;
}

Assistant:

struct effect *object_effect(const struct object *obj)
{
	if (obj->activation)
		return obj->activation->effect;
	else if (obj->effect)
		return obj->effect;
	else
		return NULL;
}